

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

PersistentColumnData * __thiscall
duckdb::ColumnData::Serialize(PersistentColumnData *__return_storage_ptr__,ColumnData *this)

{
  PhysicalType physical_type;
  bool bVar1;
  vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_> vStack_38;
  
  physical_type = (this->type).physical_type_;
  GetDataPointers((vector<duckdb::DataPointer,_true> *)&vStack_38,this);
  PersistentColumnData::PersistentColumnData
            (__return_storage_ptr__,physical_type,(vector<duckdb::DataPointer,_true> *)&vStack_38);
  ::std::vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>::~vector(&vStack_38);
  bVar1 = HasUpdates(this);
  __return_storage_ptr__->has_updates = bVar1;
  return __return_storage_ptr__;
}

Assistant:

PersistentColumnData ColumnData::Serialize() {
	PersistentColumnData result(type.InternalType(), GetDataPointers());
	result.has_updates = HasUpdates();
	return result;
}